

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogManager.cpp
# Opt level: O2

void __thiscall gnilk::LogManager::Initialize(LogManager *this)

{
  Ref *this_00;
  int iVar1;
  size_t in_stack_ffffffffffffffc8;
  __shared_ptr<gnilk::LogIPCQueue,_(__gnu_cxx::_Lock_policy)2> local_30;
  thread local_20;
  
  if (this->isInitialized == false) {
    LogCache::Create(in_stack_ffffffffffffffc8);
    std::__shared_ptr<gnilk::LogCache,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->cache).super___shared_ptr<gnilk::LogCache,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<gnilk::LogCache,_(__gnu_cxx::_Lock_policy)2> *)&local_30);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
    RegisterDefaultSinks(this);
    if ((this->ipcHandler).super___shared_ptr<gnilk::LogIPCBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        == (element_type *)0x0) {
      this_00 = &this->ipcHandler;
      if (this->ipcMechanism == kPipe) {
        std::make_shared<gnilk::LogIPCPipeUnix>();
        std::__shared_ptr<gnilk::LogIPCBase,(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_ptr<gnilk::LogIPCBase,(__gnu_cxx::_Lock_policy)2> *)this_00,
                   (__shared_ptr<gnilk::LogIPCPipeUnix,_(__gnu_cxx::_Lock_policy)2> *)&local_30);
      }
      else if (this->ipcMechanism == kFifo) {
        std::make_shared<gnilk::LogIPCFifoUnix>();
        std::__shared_ptr<gnilk::LogIPCBase,(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_ptr<gnilk::LogIPCBase,(__gnu_cxx::_Lock_policy)2> *)this_00,
                   (__shared_ptr<gnilk::LogIPCFifoUnix,_(__gnu_cxx::_Lock_policy)2> *)&local_30);
      }
      else {
        std::make_shared<gnilk::LogIPCQueue>();
        std::__shared_ptr<gnilk::LogIPCBase,(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_ptr<gnilk::LogIPCBase,(__gnu_cxx::_Lock_policy)2> *)this_00,&local_30);
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
      iVar1 = (*((this_00->super___shared_ptr<gnilk::LogIPCBase,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                )->_vptr_LogIPCBase[2])();
      if ((char)iVar1 == '\0') {
        exit(1);
      }
    }
    this->isInitialized = true;
    local_20._M_id._M_thread = (id)0;
    local_30._M_ptr = (element_type *)operator_new(0x10);
    ((local_30._M_ptr)->super_LogIPCBase)._vptr_LogIPCBase = (_func_int **)&PTR___State_001daa60;
    *(LogManager **)&(local_30._M_ptr)->isClosed = this;
    std::thread::_M_start_thread(&local_20,&local_30,0);
    if (local_30._M_ptr != (element_type *)0x0) {
      (*((local_30._M_ptr)->super_LogIPCBase)._vptr_LogIPCBase[1])();
    }
    std::thread::operator=(&this->sinkThread,&local_20);
    std::thread::~thread(&local_20);
  }
  return;
}

Assistant:

void LogManager::Initialize() {
    if (isInitialized) {
        return;
    }

    // IF we support some kind of configuration - except for compile time - we should deal with it here..
    // Option 2 - copy the 'property' object concept over from old logger and set all defaults in it - let the
    // app have the ability to supply/create/modify the Property object before we initialize...

    cache = LogCache::Create(cacheCapacity);

    RegisterDefaultSinks();

    // This should NOT happen - but let's check anyway...
    if (ipcHandler == nullptr) {
        switch(ipcMechanism) {
#ifndef WIN32
            case IPCMechanism::kFifo :
                ipcHandler = std::make_shared<LogIPCFifoUnix>();
                break;
            case IPCMechanism::kPipe :
                ipcHandler = std::make_shared<LogIPCPipeUnix>();
                break;
#endif
            case IPCMechanism::kQueue :
            default:
                ipcHandler = std::make_shared<LogIPCQueue>();
                break;
        }
        if (!ipcHandler->Open()) {
            exit(1);
        }
    }

    isInitialized = true;

    sinkThread = std::thread([this]() {
        bQuitSinkThread = false;
        SinkThread();
    });


}